

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_handle_certificate(ptls_t *tls,ptls_iovec_t message)

{
  uint8_t *msg;
  int ret;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  msg = message.base;
  message_local.len._4_4_ = client_do_handle_certificate(tls,msg + 4,msg + message.len);
  if (message_local.len._4_4_ == 0) {
    ptls__key_schedule_update_hash(tls->key_schedule,msg,message.len);
    tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
    message_local.len._4_4_ = 0x202;
  }
  return message_local.len._4_4_;
}

Assistant:

static int client_handle_certificate(ptls_t *tls, ptls_iovec_t message)
{
    int ret;

    if ((ret = client_do_handle_certificate(tls, message.base + PTLS_HANDSHAKE_HEADER_SIZE, message.base + message.len)) != 0)
        return ret;

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);

    tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
    return PTLS_ERROR_IN_PROGRESS;
}